

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::ClampSpeed(ChParticleCloud *this)

{
  double dVar1;
  double dVar2;
  pointer ppCVar3;
  uint uVar4;
  ChAparticle *pCVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  
  if (this->do_limit_speed == true) {
    ppCVar3 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->particles).
        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar3) {
      uVar4 = 1;
      uVar6 = 0;
      do {
        pCVar5 = ppCVar3[uVar6];
        dVar1 = (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
        dVar2 = (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
        auVar8._0_8_ = dVar1 * dVar1;
        auVar8._8_8_ = dVar2 * dVar2;
        auVar8 = vshufpd_avx(auVar8,auVar8,1);
        auVar8 = vfmadd213sd_fma(auVar13,auVar13,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.
                       m_data[3];
        auVar8 = vfmadd231sd_fma(auVar8,auVar14,auVar14);
        auVar8 = vfmadd213sd_fma(auVar9,auVar9,auVar8);
        dVar12 = (double)this->max_wvel;
        auVar8 = vsqrtsd_avx(auVar8,auVar8);
        dVar7 = auVar8._0_8_ + auVar8._0_8_;
        if (dVar12 < dVar7) {
          dVar7 = 1.0 / dVar7;
          local_48 = dVar7 * dVar1 * dVar12;
          dStack_40 = dVar7 * dVar2 * dVar12;
          dStack_38 = dVar7 * (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.
                              rot.m_data[2] * dVar12;
          dStack_30 = dVar7 * (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.
                              rot.m_data[3] * dVar12;
          (*(pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
            _vptr_ChFrame[8])(pCVar5,&local_48);
          ppCVar3 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar5 = ppCVar3[uVar6];
        }
        auVar8 = *(undefined1 (*) [16])
                  (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data;
        dVar12 = (double)this->max_speed;
        dVar1 = auVar8._0_8_;
        auVar10._0_8_ = dVar1 * dVar1;
        dVar2 = auVar8._8_8_;
        auVar10._8_8_ = dVar2 * dVar2;
        auVar9 = vshufpd_avx(auVar10,auVar10,1);
        dVar7 = (pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar7;
        auVar8 = vfmadd231sd_fma(auVar9,auVar8,auVar8);
        auVar8 = vfmadd231sd_fma(auVar8,auVar11,auVar11);
        auVar8 = vsqrtsd_avx(auVar8,auVar8);
        if (dVar12 < auVar8._0_8_) {
          dStack_40 = 1.0 / auVar8._0_8_;
          dStack_38 = dStack_40 * dVar7 * dVar12;
          local_48 = dStack_40 * dVar1 * dVar12;
          dStack_40 = dStack_40 * dVar2 * dVar12;
          (*(pCVar5->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
            _vptr_ChFrame[7])(pCVar5,&local_48);
          ppCVar3 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar6 < (ulong)((long)(this->particles).
                                     super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3
                              ));
    }
  }
  return;
}

Assistant:

void ChParticleCloud::ClampSpeed() {
    if (GetLimitSpeed()) {
        for (unsigned int j = 0; j < particles.size(); j++) {
            double w = 2.0 * particles[j]->GetRot_dt().Length();
            if (w > max_wvel)
                particles[j]->SetRot_dt(particles[j]->GetRot_dt() * max_wvel / w);

            double v = particles[j]->GetPos_dt().Length();
            if (v > max_speed)
                particles[j]->SetPos_dt(particles[j]->GetPos_dt() * max_speed / v);
        }
    }
}